

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O2

void __thiscall ThreadPool::~ThreadPool(ThreadPool *this)

{
  pointer ptVar1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  thread *worker;
  pointer ptVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  std::unique_lock<std::mutex>::unique_lock(&local_30,&this->queue_mutex);
  this->stop = true;
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  std::condition_variable::notify_all();
  ptVar1 = (this->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::condition_variable::~condition_variable(&this->sync_condition);
  std::condition_variable::~condition_variable(&this->condition);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&(this->tasks).c);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->workers);
  return;
}

Assistant:

inline ThreadPool::~ThreadPool() {
  {
    std::unique_lock<std::mutex> lock(queue_mutex);
    stop = true;
  }
  condition.notify_all();
  for (std::thread &worker: workers) {
    worker.join();
  }
}